

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<void,_kj::_::IdentityFunc<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1620:15)>
::getImpl(TransformPromiseNode<void,_kj::_::IdentityFunc<void>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:1620:15)>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::_::Void> depResult;
  ExceptionOr<kj::_::Void> local_350;
  NullableValue<kj::Exception> local_1b0;
  char local_18;
  
  local_1b0.isSet = false;
  local_18 = '\0';
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)&local_1b0);
  if (local_1b0.isSet == true) {
    anon_class_8_1_8d3fdb05_for_errorHandler::operator()
              (&this->errorHandler,&local_1b0.field_1.value);
    local_350.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_350.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_350);
  }
  else {
    if (local_18 != '\x01') goto LAB_001e91bd;
    local_350.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_350.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_350);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_350);
LAB_001e91bd:
  NullableValue<kj::Exception>::~NullableValue(&local_1b0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    // Derive return type from DepT to reduce templating.
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = handle<T>(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(depException)));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }